

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
::insert_column<std::initializer_list<unsigned_int>>
          (Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true,false,true>>>
           *this,initializer_list<unsigned_int> *column)

{
  Dimension dim;
  
  dim = 0;
  if (column->_M_len != 0) {
    dim = (int)column->_M_len + -1;
  }
  _insert<std::initializer_list<unsigned_int>>(this,column,*(Index *)(this + 0x58),dim);
  *(int *)(this + 0x58) = *(int *)(this + 0x58) + 1;
  return;
}

Assistant:

inline void Base_matrix<Master_matrix>::insert_column(const Container& column)
{
  //TODO: dim not actually stored right now, so either get rid of it or store it again
  _insert(column, nextInsertIndex_, column.size() == 0 ? 0 : column.size() - 1);
  ++nextInsertIndex_;
}